

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O0

array<cv::RotatedRect,_10UL> *
ellipses::find_target(array<cv::RotatedRect,_10UL> *__return_storage_ptr__,Mat *img,bool debug)

{
  pointer *ppvVar1;
  reference pRVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  ulong uVar7;
  ostream *poVar8;
  reference pvVar9;
  array<cv::RotatedRect,_3UL> local_554;
  ulong local_518;
  size_t value;
  allocator<char> local_4f1;
  string local_4f0 [39];
  allocator<char> local_4c9;
  string local_4c8 [32];
  Scalar_<double> local_4a8;
  _InputOutputArray local_488;
  Scalar_<double> local_470;
  Point_ local_450 [8];
  _InputOutputArray local_448;
  reference local_430;
  RotatedRect *e;
  iterator __end2;
  iterator __begin2;
  vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *__range2;
  uchar shade;
  Scalar_<double> local_400;
  _InputArray local_3e0;
  _InputOutputArray local_3c8;
  Mat local_3b0 [8];
  Mat tmp;
  undefined1 local_350 [8];
  pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect> pair;
  future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>
  *async_p;
  iterator __end1;
  iterator __begin1;
  vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
  *__range1;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> ellipses;
  future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>
  local_2c8;
  undefined1 local_2b1;
  future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>
  local_2b0;
  ulong local_2a0;
  size_t i;
  vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
  async_ellipse_process;
  array<bool,_5UL> debug_contour;
  array<bool,_5UL> agregate_contour;
  undefined1 local_260 [8];
  array<cv::Mat,_5UL> filtered_images;
  Mat pretreat;
  bool debug_local;
  Mat *img_local;
  
  pretreatment((Mat *)&filtered_images.field_0x1d8);
  filter_image((array<cv::Mat,_5UL> *)local_260,(Mat *)&filtered_images.field_0x1d8);
  debug_contour._M_elems[4] = false;
  debug_contour._M_elems[0] = true;
  debug_contour._M_elems[1] = true;
  debug_contour._M_elems[2] = true;
  debug_contour._M_elems[3] = true;
  async_ellipse_process.
  super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::
  vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
  ::vector((vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
            *)&i);
  sVar4 = std::array<cv::Mat,_5UL>::size((array<cv::Mat,_5UL> *)local_260);
  std::
  vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
  ::reserve((vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
             *)&i,sVar4);
  for (local_2a0 = 0; local_2a0 < 3; local_2a0 = local_2a0 + 1) {
    pvVar5 = std::array<bool,_5UL>::operator[]
                       ((array<bool,_5UL> *)
                        ((long)&async_ellipse_process.
                                super__Vector_base<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),local_2a0);
    if ((*pvVar5 & 1U) == 0) {
      pvVar6 = std::array<cv::Mat,_5UL>::operator[]((array<cv::Mat,_5UL> *)local_260,local_2a0);
      pvVar5 = std::array<bool,_5UL>::operator[](&debug_contour,local_2a0);
      std::
      async<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>(&)(cv::Mat_const&,cv::Mat_const&,bool,bool),cv::Mat&,cv::Mat_const&,bool&,bool>
                ((_func_pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_Mat_ptr_Mat_ptr_bool_bool
                  *)&local_2c8,(Mat *)detect_circle_approach,pvVar6,(bool *)img,pvVar5);
      std::
      vector<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>,std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>>>
      ::
      emplace_back<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>>
                ((vector<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>,std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>>>
                  *)&i,&local_2c8);
      std::
      future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>
      ::~future(&local_2c8);
    }
    else {
      pvVar6 = std::array<cv::Mat,_5UL>::operator[]((array<cv::Mat,_5UL> *)local_260,local_2a0);
      pvVar5 = std::array<bool,_5UL>::operator[](&debug_contour,local_2a0);
      local_2b1 = 1;
      std::
      async<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>(&)(cv::Mat_const&,cv::Mat_const&,bool,bool),cv::Mat&,cv::Mat_const&,bool&,bool>
                ((launch)&local_2b0,
                 (_func_pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_Mat_ptr_Mat_ptr_bool_bool
                  *)0x2,(Mat *)detect_circle_approach,pvVar6,(bool *)img,pvVar5);
      std::
      vector<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>,std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>>>
      ::
      emplace_back<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>>
                ((vector<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>,std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,cv::RotatedRect>>>>
                  *)&i,&local_2b0);
      std::
      future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>
      ::~future(&local_2b0);
    }
  }
  ppvVar1 = &contours.
             super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::vector
            ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)ppvVar1);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            *)&__range1);
  sVar4 = std::
          vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
          ::size((vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
                  *)&i);
  std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::reserve
            ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)ppvVar1,sVar4);
  sVar4 = std::
          vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
          ::size((vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
                  *)&i);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::reserve((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)&__range1,sVar4);
  __end1 = std::
           vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
           ::begin((vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
                    *)&i);
  async_p = (future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>
             *)std::
               vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
               ::end((vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
                      *)&i);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_*,_std::vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>_>
                                *)&async_p);
    if (!bVar3) break;
    pair._40_8_ = __gnu_cxx::
                  __normal_iterator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_*,_std::vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>_>
                  ::operator*(&__end1);
    std::
    future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>
    ::get((pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect> *)
          local_350,
          (future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>
           *)pair._40_8_);
    sVar4 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                      ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_350);
    if (sVar4 != 0) {
      std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::emplace_back<cv::RotatedRect>
                ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)
                 &contours.
                  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (RotatedRect *)
                 &pair.first.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
      ::emplace_back<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
                ((vector<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>,std::allocator<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>>
                  *)&__range1,
                 (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_350);
    }
    std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>::
    ~pair((pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect> *)
          local_350);
    __gnu_cxx::
    __normal_iterator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_*,_std::vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>_>
    ::operator++(&__end1);
  }
  if (debug) {
    cv::Mat::clone();
    cv::_InputOutputArray::_InputOutputArray(&local_3c8,local_3b0);
    cv::_InputArray::_InputArray<cv::Point_<int>>
              (&local_3e0,
               (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                *)&__range1);
    cv::Scalar_<double>::Scalar_(&local_400,255.0,0.0,0.0,0.0);
    uVar7 = cv::noArray();
    cv::Point_<int>::Point_((Point_<int> *)&stack0xfffffffffffffbf8);
    cv::drawContours(&local_3c8,&local_3e0,0xffffffff,&local_400,3,8,uVar7,0x7fffffff,
                     &stack0xfffffffffffffbf8);
    cv::_InputArray::~_InputArray(&local_3e0);
    cv::_InputOutputArray::~_InputOutputArray(&local_3c8);
    __range2._7_1_ = 0x20;
    ppvVar1 = &contours.
               super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end2 = std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::begin
                       ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)ppvVar1);
    e = (RotatedRect *)
        std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::end
                  ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)ppvVar1);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<cv::RotatedRect_*,_std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>_>
                                  *)&e);
      if (!bVar3) break;
      local_430 = __gnu_cxx::
                  __normal_iterator<cv::RotatedRect_*,_std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>_>
                  ::operator*(&__end2);
      cv::_InputOutputArray::_InputOutputArray(&local_448,local_3b0);
      cv::Point_::operator_cast_to_Point_(local_450);
      cv::Scalar_<double>::Scalar_(&local_470,0.0,0.0,(double)__range2._7_1_,0.0);
      uVar7 = uVar7 & 0xffffffff00000000;
      cv::circle(&local_448,local_450,10,&local_470,6,8,uVar7);
      cv::_InputOutputArray::~_InputOutputArray(&local_448);
      cv::_InputOutputArray::_InputOutputArray(&local_488,local_3b0);
      pRVar2 = local_430;
      cv::Scalar_<double>::Scalar_(&local_4a8,0.0,255.0,0.0,0.0);
      cv::ellipse(&local_488,pRVar2,(Scalar_ *)&local_4a8,3,8);
      cv::_InputOutputArray::~_InputOutputArray(&local_488);
      __range2._7_1_ = __range2._7_1_ + 0x20;
      __gnu_cxx::
      __normal_iterator<cv::RotatedRect_*,_std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>_>
      ::operator++(&__end2);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_4c8,"Output",&local_4c9);
    cv::namedWindow(local_4c8,0);
    std::__cxx11::string::~string(local_4c8);
    std::allocator<char>::~allocator(&local_4c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_4f0,"Output",&local_4f1);
    cv::_InputArray::_InputArray((_InputArray *)&value,local_3b0);
    cv::imshow(local_4f0,(_InputArray *)&value);
    cv::_InputArray::~_InputArray((_InputArray *)&value);
    std::__cxx11::string::~string(local_4f0);
    std::allocator<char>::~allocator(&local_4f1);
    cv::waitKey(0);
    cv::destroyAllWindows();
    cv::Mat::~Mat(local_3b0);
  }
  local_518 = find_weakest_element
                        ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)
                         &contours.
                          super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (debug) {
    poVar8 = std::operator<<((ostream *)&std::cout,"weakest ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_518);
    std::operator<<(poVar8,'\n');
  }
  pvVar9 = std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::operator[]
                     ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)
                      &contours.
                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  cv::RotatedRect::RotatedRect(local_554._M_elems,pvVar9);
  pvVar9 = std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::operator[]
                     ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)
                      &contours.
                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
  cv::RotatedRect::RotatedRect(local_554._M_elems + 1,pvVar9);
  pvVar9 = std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::operator[]
                     ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)
                      &contours.
                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,2);
  cv::RotatedRect::RotatedRect(local_554._M_elems + 2,pvVar9);
  compute_final_ellipses_by_linear_interpolation(__return_storage_ptr__,&local_554,local_518);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)&__range1);
  std::vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_>::~vector
            ((vector<cv::RotatedRect,_std::allocator<cv::RotatedRect>_> *)
             &contours.
              super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
  ::~vector((vector<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>,_std::allocator<std::future<std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>_>_>_>
             *)&i);
  std::array<cv::Mat,_5UL>::~array((array<cv::Mat,_5UL> *)local_260);
  cv::Mat::~Mat((Mat *)&filtered_images.field_0x1d8);
  return __return_storage_ptr__;
}

Assistant:

std::array<cv::RotatedRect, 10> find_target(const cv::Mat& img, bool debug)
{
    cv::Mat pretreat = pretreatment(img);
    std::array<cv::Mat, 5> filtered_images = filter_image(pretreat);
    std::array<bool, 5> agregate_contour {true, true, true, true, false};
    std::array<bool, 5> debug_contour {false, false, false, false, false};

    std::vector<std::future<std::pair<std::vector<cv::Point>, cv::RotatedRect>>> async_ellipse_process;
    async_ellipse_process.reserve(filtered_images.size());
    for(std::size_t i = 0; i < 3; i++)
    {
        if(debug_contour[i])
        {
            async_ellipse_process.emplace_back(std::async(
                std::launch::deferred, detect_circle_approach, filtered_images[i], img, agregate_contour[i], true));
        }
        else
        {
            async_ellipse_process.emplace_back(
                std::async(detect_circle_approach, filtered_images[i], img, agregate_contour[i], false));
        }
    }

    std::vector<cv::RotatedRect> ellipses;
    std::vector<std::vector<cv::Point>> contours;
    ellipses.reserve(async_ellipse_process.size());
    contours.reserve(async_ellipse_process.size());
    for(auto& async_p : async_ellipse_process)
    {
        auto pair = async_p.get();
        if(pair.first.size())
        {
            ellipses.emplace_back(std::move(pair.second));
            contours.emplace_back(std::move(pair.first));
        }
    }

    if(debug)
    {
        auto tmp = img.clone();
        cv::drawContours(tmp, contours, -1, cv::Scalar(255, 0, 0), 3);
        unsigned char shade = 32;
        for(const auto& e : ellipses)
        {
            cv::circle(tmp, e.center, 10, cv::Scalar(0, 0, shade), 6);
            cv::ellipse(tmp, e, cv::Scalar(0, 255, 0), 3);
            shade += 32;
        }

        cv::namedWindow("Output", cv::WINDOW_NORMAL);
        cv::imshow("Output", tmp);
        cv::waitKey(0);
        cv::destroyAllWindows();
    }

    auto value = find_weakest_element(ellipses);

    if(debug)
    {
        std::cout << "weakest " << value << '\n';
    }

    return compute_final_ellipses_by_linear_interpolation({ellipses[0], ellipses[1], ellipses[2]}, value);
}